

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Map.h
# Opt level: O3

Map<asl::String,_int> * __thiscall
asl::Map<asl::String,_int>::set(Map<asl::String,_int> *this,String *key,int *value)

{
  int n;
  uint uVar1;
  undefined8 __dest;
  anon_union_16_2_78e7fdac_for_String_2 *__src;
  KeyVal local_50;
  
  uVar1 = indexOf(this,key);
  if ((int)uVar1 < 0) {
    n = key->_len;
    String::alloc(&local_50.key,n);
    __dest = local_50.key.field_2._str;
    if (local_50.key._size == 0) {
      __dest = &local_50.key.field_2;
    }
    if (key->_size == 0) {
      __src = &key->field_2;
    }
    else {
      __src = (anon_union_16_2_78e7fdac_for_String_2 *)(key->field_2)._str;
    }
    local_50.key._len = n;
    memcpy((void *)__dest,__src,(long)n + 1);
    local_50.value = *value;
    Array<asl::Map<asl::String,_int>::KeyVal>::insert(&this->a,~uVar1,&local_50);
    if (local_50.key._size != 0) {
      free(local_50.key.field_2._str);
    }
  }
  else {
    (this->a)._a[uVar1].value = *value;
  }
  return this;
}

Assistant:

Map& set(const K& key, const T& value)
	{
		int i=indexOf(key);
		if(i >= 0)
		{
			a[i].value = value;
			return *this;
		}
		a.insert(-i-1, KeyVal(key, value));
		return *this;
	}